

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

uint64_t __thiscall mkvmuxer::Track::PayloadSize(Track *this)

{
  uint uVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  uint64_t uVar5;
  uint32_t i;
  ulong uVar6;
  uint64_t uVar7;
  uint64_t content_encodings_size;
  
  uVar2 = EbmlElementSize(0xd7,this->number_);
  uVar3 = EbmlElementSize(0x73c5,this->uid_);
  uVar4 = EbmlElementSize(0x83,this->type_);
  uVar7 = uVar4 + uVar3 + uVar2;
  if (this->codec_id_ != (char *)0x0) {
    uVar2 = EbmlElementSize(0x86,this->codec_id_);
    uVar7 = uVar7 + uVar2;
  }
  if (this->codec_private_ != (uint8 *)0x0) {
    uVar2 = EbmlElementSize(0x63a2,this->codec_private_,this->codec_private_length_);
    uVar7 = uVar7 + uVar2;
  }
  if (this->language_ != (char *)0x0) {
    uVar2 = EbmlElementSize(0x22b59c,this->language_);
    uVar7 = uVar7 + uVar2;
  }
  if (this->name_ != (char *)0x0) {
    uVar2 = EbmlElementSize(0x536e,this->name_);
    uVar7 = uVar7 + uVar2;
  }
  if (this->max_block_additional_id_ != 0) {
    uVar2 = EbmlElementSize(0x55ee,this->max_block_additional_id_);
    uVar7 = uVar7 + uVar2;
  }
  if (this->codec_delay_ != 0) {
    uVar2 = EbmlElementSize(0x56aa,this->codec_delay_);
    uVar7 = uVar7 + uVar2;
  }
  if (this->seek_pre_roll_ != 0) {
    uVar2 = EbmlElementSize(0x56bb,this->seek_pre_roll_);
    uVar7 = uVar7 + uVar2;
  }
  if (this->default_duration_ != 0) {
    uVar2 = EbmlElementSize(0x23e383,this->default_duration_);
    uVar7 = uVar7 + uVar2;
  }
  uVar1 = this->content_encoding_entries_size_;
  if (uVar1 != 0) {
    uVar2 = 0;
    for (uVar6 = 0; uVar6 < uVar1; uVar6 = uVar6 + 1) {
      uVar5 = ContentEncoding::Size(this->content_encoding_entries_[uVar6]);
      uVar2 = uVar2 + uVar5;
      uVar1 = this->content_encoding_entries_size_;
    }
    uVar3 = EbmlMasterElementSize(0x6d80,uVar2);
    uVar7 = uVar7 + uVar2 + uVar3;
  }
  return uVar7;
}

Assistant:

uint64_t Track::PayloadSize() const {
  uint64_t size =
      EbmlElementSize(libwebm::kMkvTrackNumber, static_cast<uint64>(number_));
  size += EbmlElementSize(libwebm::kMkvTrackUID, static_cast<uint64>(uid_));
  size += EbmlElementSize(libwebm::kMkvTrackType, static_cast<uint64>(type_));
  if (codec_id_)
    size += EbmlElementSize(libwebm::kMkvCodecID, codec_id_);
  if (codec_private_)
    size += EbmlElementSize(libwebm::kMkvCodecPrivate, codec_private_,
                            codec_private_length_);
  if (language_)
    size += EbmlElementSize(libwebm::kMkvLanguage, language_);
  if (name_)
    size += EbmlElementSize(libwebm::kMkvName, name_);
  if (max_block_additional_id_) {
    size += EbmlElementSize(libwebm::kMkvMaxBlockAdditionID,
                            static_cast<uint64>(max_block_additional_id_));
  }
  if (codec_delay_) {
    size += EbmlElementSize(libwebm::kMkvCodecDelay,
                            static_cast<uint64>(codec_delay_));
  }
  if (seek_pre_roll_) {
    size += EbmlElementSize(libwebm::kMkvSeekPreRoll,
                            static_cast<uint64>(seek_pre_roll_));
  }
  if (default_duration_) {
    size += EbmlElementSize(libwebm::kMkvDefaultDuration,
                            static_cast<uint64>(default_duration_));
  }

  if (content_encoding_entries_size_ > 0) {
    uint64_t content_encodings_size = 0;
    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      content_encodings_size += encoding->Size();
    }

    size += EbmlMasterElementSize(libwebm::kMkvContentEncodings,
                                  content_encodings_size) +
            content_encodings_size;
  }

  return size;
}